

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddSignWithPrivkeySimple
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *pubkey,char *privkey,int64_t value_satoshi,int sighash_type,
              bool sighash_anyone_can_pay,bool has_grind_r,char **tx_string)

{
  bool bVar1;
  undefined1 uVar2;
  AddressType AVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  char *in_RCX;
  uint uVar7;
  ConfidentialTransactionContext *in_RDX;
  uint32_t in_R8D;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int64_t in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000030;
  undefined8 *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  bool is_bitcoin;
  SigHashType sighashtype;
  OutPoint outpoint;
  KeyApi keyapi;
  string privkey_str;
  Privkey privkey_obj;
  Amount value;
  AddressType addr_type;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  string *in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  allocator *paVar8;
  bool *in_stack_fffffffffffff9d8;
  string *in_stack_fffffffffffff9e0;
  string *message;
  undefined1 has_grind_r_00;
  undefined4 in_stack_fffffffffffffa08;
  string *in_stack_fffffffffffffa10;
  Privkey *in_stack_fffffffffffffa18;
  Pubkey *in_stack_fffffffffffffa20;
  OutPoint *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  AddressType in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffaa7;
  Amount *in_stack_fffffffffffffaa8;
  SigHashType *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffac0;
  OutPoint *in_stack_fffffffffffffac8;
  TransactionContext *in_stack_fffffffffffffad0;
  string local_528 [8];
  AddressType in_stack_fffffffffffffae0;
  Pubkey local_508;
  allocator local_4e9;
  string local_4e8 [32];
  AbstractTransaction local_4c8 [13];
  string local_3f0;
  SigHashType local_3d0;
  allocator local_3c1;
  string local_3c0;
  Pubkey local_3a0;
  undefined1 local_381 [33];
  AbstractTransaction local_360 [11];
  byte local_2a1;
  SigHashType local_2a0;
  allocator local_291;
  string local_290;
  Txid local_270;
  OutPoint local_250;
  KeyApi local_201;
  Privkey local_200;
  allocator local_1d9;
  string local_1d8;
  Privkey local_1b8;
  Amount local_198;
  AddressType local_188;
  undefined1 local_182;
  allocator local_181;
  string local_180 [32];
  CfdSourceLocation local_160;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  byte local_32;
  byte local_31;
  uint32_t local_2c;
  char *local_28;
  ConfidentialTransactionContext *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff998 >> 0x20);
  local_31 = in_stack_00000028 & 1;
  local_32 = in_stack_00000030 & 1;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x726;
    local_60.funcname = "CfdAddSignWithPrivkeySimple";
    cfd::core::logger::warn<>(&local_60,"tx is null or empty.");
    local_82 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. tx is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9a0,error_code,in_stack_fffffffffffff990);
    local_82 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x72c;
    local_a0.funcname = "CfdAddSignWithPrivkeySimple";
    cfd::core::logger::warn<>(&local_a0,"txid is null or empty.");
    local_c2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. txid is null or empty.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9a0,error_code,in_stack_fffffffffffff990);
    local_c2 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x732;
    local_e0.funcname = "CfdAddSignWithPrivkeySimple";
    cfd::core::logger::warn<>(&local_e0,"pubkey is null or empty.");
    local_102 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    paVar8 = &local_101;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"Failed to parameter. pubkey is null or empty.",paVar8);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff9a0,error_code,in_stack_fffffffffffff990);
    local_102 = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar2 = cfd::capi::IsEmptyString(in_stack_00000010);
  if (!(bool)uVar2) {
    if (in_stack_00000038 == (undefined8 *)0x0) {
      local_160.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_160.filename = local_160.filename + 1;
      local_160.line = 0x73e;
      local_160.funcname = "CfdAddSignWithPrivkeySimple";
      cfd::core::logger::warn<>(&local_160,"tx output is null.");
      local_182 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      paVar8 = &local_181;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"Failed to parameter. tx output is null.",paVar8);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffff9a0,error_code,in_stack_fffffffffffff990);
      local_182 = 0;
      __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    AVar3 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
    local_188 = AVar3;
    cfd::core::Amount::Amount(&local_198,in_stack_00000018);
    cfd::core::Privkey::Privkey(&local_1b8);
    paVar8 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,in_stack_00000010,paVar8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    lVar5 = std::__cxx11::string::length();
    if (lVar5 == 0x40) {
      cfd::core::Privkey::Privkey(&local_200,&local_1d8,kMainnet,true);
      has_grind_r_00 = (undefined1)((ulong)paVar8 >> 0x38);
      cfd::core::Privkey::operator=
                ((Privkey *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                 (Privkey *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      cfd::core::Privkey::~Privkey((Privkey *)0x64d69a);
    }
    else {
      cfd::api::KeyApi::KeyApi(&local_201);
      cfd::api::KeyApi::GetPrivkeyFromWif
                ((KeyApi *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                 (NetType *)CONCAT44(AVar3,in_stack_fffffffffffffa08),(bool *)paVar8);
      has_grind_r_00 = (undefined1)((ulong)paVar8 >> 0x38);
      cfd::core::Privkey::operator=
                ((Privkey *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                 (Privkey *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      cfd::core::Privkey::~Privkey((Privkey *)0x64d75e);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,local_28,&local_291);
    cfd::core::Txid::Txid(&local_270,&local_290);
    cfd::core::OutPoint::OutPoint(&local_250,&local_270,local_2c);
    cfd::core::Txid::~Txid((Txid *)0x64d800);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    cfd::core::SigHashType::Create(&local_2a0,in_stack_00000020,(bool)(local_31 & 1),false);
    local_2a1 = 0;
    cfd::capi::ConvertNetType
              ((int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),in_stack_fffffffffffff9d8);
    if ((local_2a1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e8,(char *)local_20,&local_4e9);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (local_20,in_stack_fffffffffffff9a8);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
      paVar8 = (allocator *)&stack0xfffffffffffffad7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,in_stack_00000008,paVar8);
      cfd::core::Pubkey::Pubkey(&local_508,(string *)local_528);
      cfd::core::SigHashType::SigHashType((SigHashType *)&stack0xfffffffffffffac8,&local_2a0);
      uVar7 = local_32 & 1;
      cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
                ((ConfidentialTransactionContext *)CONCAT17(uVar2,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                 (SigHashType *)in_stack_fffffffffffffa10,
                 (Amount *)CONCAT44(AVar3,in_stack_fffffffffffffa08),in_stack_fffffffffffffa40,
                 (bool)has_grind_r_00);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x64dcb8);
      std::__cxx11::string::~string(local_528);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffad7);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&stack0xfffffffffffffaa8,local_4c8);
      pcVar6 = cfd::capi::CreateString(in_stack_fffffffffffff9e0);
      *in_stack_00000038 = pcVar6;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa8);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_fffffffffffff984,uVar7));
    }
    else {
      message = (string *)local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_381 + 1),(char *)local_20,(allocator *)message);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980)
                 ,(string *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
      std::__cxx11::string::~string((string *)(local_381 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_381);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c0,in_stack_00000008,&local_3c1);
      cfd::core::Pubkey::Pubkey(&local_3a0,&local_3c0);
      cfd::core::SigHashType::SigHashType(&local_3d0,&local_2a0);
      uVar7 = local_32 & 1;
      cfd::TransactionContext::SignWithPrivkeySimple
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (Pubkey *)in_stack_fffffffffffffac0,(Privkey *)in_stack_fffffffffffffab8,
                 in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffae0,
                 (bool)in_stack_fffffffffffffaa7);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x64d997);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_3f0,local_360);
      pcVar6 = cfd::capi::CreateString(message);
      *in_stack_00000038 = pcVar6;
      std::__cxx11::string::~string((string *)&local_3f0);
      cfd::TransactionContext::~TransactionContext
                ((TransactionContext *)CONCAT44(in_stack_fffffffffffff984,uVar7));
    }
    local_4 = 0;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x64de3c);
    std::__cxx11::string::~string((string *)&local_1d8);
    cfd::core::Privkey::~Privkey((Privkey *)0x64de56);
    return local_4;
  }
  local_120.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_120.filename = local_120.filename + 1;
  local_120.line = 0x738;
  local_120.funcname = "CfdAddSignWithPrivkeySimple";
  cfd::core::logger::warn<>(&local_120,"privkey is null or empty.");
  local_142 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  paVar8 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"Failed to parameter. privkey is null or empty.",paVar8);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff9a0,error_code,in_stack_fffffffffffff990);
  local_142 = 0;
  __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddSignWithPrivkeySimple(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey, const char* privkey,
    int64_t value_satoshi, int sighash_type, bool sighash_anyone_can_pay,
    bool has_grind_r, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Amount value = Amount(value_satoshi);

    Privkey privkey_obj;
    std::string privkey_str(privkey);
    if (privkey_str.length() == (Privkey::kPrivkeySize * 2)) {
      privkey_obj = Privkey(privkey_str);
    } else {
      KeyApi keyapi;
      privkey_obj = keyapi.GetPrivkeyFromWif(privkey_str);
    }

    OutPoint outpoint(Txid(txid), vout);
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.SignWithPrivkeySimple(
          outpoint, Pubkey(pubkey), privkey_obj, sighashtype, value, addr_type,
          has_grind_r);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.SignWithPrivkeySimple(
          outpoint, Pubkey(pubkey), privkey_obj, sighashtype, value, addr_type,
          has_grind_r);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}